

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionReturnType
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  void *pvVar1;
  long *plVar2;
  size_t sVar3;
  OutputStream S;
  OutputStream local_38;
  
  pvVar1 = this->RootNode;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("RootNode != nullptr && \"must call partialDemangle()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x145a,"bool llvm::ItaniumPartialDemangler::isFunction() const");
  }
  if (*(char *)((long)pvVar1 + 8) == '\x12') {
    local_38.CurrentPackIndex = 0xffffffff;
    local_38.CurrentPackMax = 0xffffffff;
    if (Buf == (char *)0x0) {
      sVar3 = 0x80;
      Buf = (char *)malloc(0x80);
      if (Buf == (char *)0x0) goto LAB_0018930c;
    }
    else {
      sVar3 = *N;
    }
    local_38.CurrentPosition = 0;
    plVar2 = *(long **)((long)pvVar1 + 0x10);
    local_38.Buffer = Buf;
    local_38.BufferCapacity = sVar3;
    if ((plVar2 != (long *)0x0) &&
       ((**(code **)(*plVar2 + 0x20))(plVar2,&local_38), *(char *)((long)plVar2 + 9) != '\x01')) {
      (**(code **)(*plVar2 + 0x28))(plVar2,&local_38);
    }
    OutputStream::grow(&local_38,1);
    local_38.Buffer[local_38.CurrentPosition] = '\0';
    if (N != (size_t *)0x0) {
      *N = local_38.CurrentPosition + 1;
    }
  }
  else {
LAB_0018930c:
    local_38.Buffer = (char *)0x0;
  }
  return local_38.Buffer;
}

Assistant:

bool ItaniumPartialDemangler::isFunction() const {
  assert(RootNode != nullptr && "must call partialDemangle()");
  return static_cast<Node *>(RootNode)->getKind() == Node::KFunctionEncoding;
}